

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O0

RecycledSyncObject<VulkanUtilities::VkSemaphoreType> * __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
operator=(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this,
         RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *rhs)

{
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *rhs_local;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this_local;
  
  Release(this);
  std::shared_ptr<VulkanUtilities::VulkanSyncObjectManager>::operator=
            (&this->m_pManager,&rhs->m_pManager);
  this->m_VkSyncObject = rhs->m_VkSyncObject;
  this->m_IsUnsignaled = (bool)(rhs->m_IsUnsignaled & 1);
  rhs->m_VkSyncObject = (NativeType)0x0;
  return this;
}

Assistant:

RecycledSyncObject& operator=(RecycledSyncObject&& rhs) noexcept
    {
        Release();
        m_pManager         = std::move(rhs.m_pManager);
        m_VkSyncObject     = rhs.m_VkSyncObject;
        m_IsUnsignaled     = rhs.m_IsUnsignaled;
        rhs.m_VkSyncObject = VK_NULL_HANDLE;
        return *this;
    }